

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigs.h
# Opt level: O2

void __thiscall
sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::eraseEntries
          (BasicSignal<void_(),_std::lock_guard<std::mutex>_> *this,
          function<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>_>)>
          *pred)

{
  bool bVar1;
  iterator __args;
  
  __args._M_current =
       (this->entries).
       super__Vector_base<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  while (__args._M_current !=
         (this->entries).
         super__Vector_base<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = std::
            function<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>_>)>
            ::operator()(pred,(__normal_iterator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>_>
                               )__args._M_current);
    if (bVar1) {
      __args = eraseEntry(this,__args);
    }
    else {
      __args._M_current = __args._M_current + 1;
    }
  }
  return;
}

Assistant:

void eraseEntries(std::function<bool(typename Cont::iterator)> pred = [](auto /*unused*/) {
    return true;
  }) noexcept
  {
    for (auto it = entries.begin(); it != entries.end();) {
      if (pred(it)) {
        it = eraseEntry(it);
      }
      else {
        ++it;
      }
    }
  }